

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

void us_internal_timer_sweep(us_loop_t *loop)

{
  unsigned_short uVar1;
  us_socket_t *puVar2;
  us_socket_t *s;
  us_socket_t *puVar3;
  us_socket_context_t *context;
  us_socket_context_t *puVar4;
  
  puVar4 = (loop->data).head;
  (loop->data).iterator = puVar4;
  do {
    if (puVar4 == (us_socket_context_t *)0x0) {
      return;
    }
    puVar3 = puVar4->head;
    puVar4->iterator = puVar3;
    if (puVar3 != (us_socket_t *)0x0) {
      do {
        if ((puVar3->timeout == 0) ||
           (uVar1 = puVar3->timeout - 1, puVar3->timeout = uVar1, uVar1 != 0)) {
LAB_001053b8:
          puVar2 = puVar3->next;
          puVar4->iterator = puVar2;
        }
        else {
          (*puVar4->on_socket_timeout)(puVar3);
          puVar2 = puVar4->iterator;
          if (puVar3 == puVar2) goto LAB_001053b8;
        }
        puVar3 = puVar2;
      } while (puVar2 != (us_socket_t *)0x0);
      puVar4 = (loop->data).iterator;
    }
    puVar4 = puVar4->next;
    (loop->data).iterator = puVar4;
  } while( true );
}

Assistant:

void us_internal_timer_sweep(struct us_loop_t *loop) {
    struct us_internal_loop_data_t *loop_data = &loop->data;
    for (loop_data->iterator = loop_data->head; loop_data->iterator; loop_data->iterator = loop_data->iterator->next) {

        struct us_socket_context_t *context = loop_data->iterator;
        for (context->iterator = context->head; context->iterator; ) {

            struct us_socket_t *s = context->iterator;
            if (s->timeout && --(s->timeout) == 0) {

                context->on_socket_timeout(s);

                /* Check for unlink / link */
                if (s == context->iterator) {
                    context->iterator = s->next;
                }
            } else {
                context->iterator = s->next;
            }
        }
    }
}